

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::HierarchicalReference::Element>::
emplace_back<slang::ast::InstanceArraySymbol&,std::pair<int,int>>
          (SmallVectorBase<slang::ast::HierarchicalReference::Element> *this,
          InstanceArraySymbol *args,pair<int,_int> *args_1)

{
  pair<int,_int> in_RDX;
  Symbol *in_RDI;
  SmallVectorBase<slang::ast::HierarchicalReference::Element> *in_stack_00000030;
  pointer local_8;
  
  if ((char *)(in_RDI->name)._M_len == (in_RDI->name)._M_str) {
    end((SmallVectorBase<slang::ast::HierarchicalReference::Element> *)in_RDI);
    local_8 = emplaceRealloc<slang::ast::InstanceArraySymbol&,std::pair<int,int>>
                        (in_stack_00000030,(pointer)this,args,args_1);
  }
  else {
    end((SmallVectorBase<slang::ast::HierarchicalReference::Element> *)in_RDI);
    ast::HierarchicalReference::Element::Element(*(Element **)in_RDX,in_RDI,in_RDX);
    (in_RDI->name)._M_len = (in_RDI->name)._M_len + 1;
    local_8 = back((SmallVectorBase<slang::ast::HierarchicalReference::Element> *)in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }